

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classloader.cpp
# Opt level: O1

u4 __thiscall ClassLoader::readU4(ClassLoader *this,FILE *fp)

{
  ulong uVar1;
  uint in_EAX;
  int iVar2;
  uint uVar3;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  uVar1 = uStack_28;
  if (this->isLittleEndian == true) {
    iVar2 = 0x18;
    uStack_28._4_4_ = 0;
    uVar3 = uStack_28._4_4_;
    uStack_28 = uVar1;
    do {
      uStack_28._0_4_ = (uint)(uint3)uStack_28;
      fread((void *)((long)&uStack_28 + 3),1,1,(FILE *)fp);
      uVar3 = uVar3 + ((uint)uStack_28._3_1_ << ((byte)iVar2 & 0x1f));
      iVar2 = iVar2 + -8;
    } while (iVar2 != -8);
    uStack_28 = (ulong)uVar3 << 0x20;
  }
  else {
    fread((void *)((long)&uStack_28 + 4),4,1,(FILE *)fp);
  }
  return uStack_28._4_4_;
}

Assistant:

u4 ClassLoader::readU4(FILE *fp) {
    u4 result = 0;
    
    if (isLittleEndian) {
        for (int i = 0; i < 4; i++) {
            result += readU1(fp) << (24 - 8*i);
        }
    } else {
        fread(&result, sizeof(u4), 1, fp);
    }
    
    return result;
}